

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O0

MPP_RET adaptive_memory_management(H264_DpbBuf_t *p_Dpb,H264_StorePic_t *p)

{
  int iVar1;
  h264d_video_ctx_t *phVar2;
  h264_drpm_t *phVar3;
  RK_S32 local_4c;
  RK_S32 local_48;
  H264dVideoCtx_t *p_Vid;
  MPP_RET ret;
  H264_DRPM_t *tmp_drpm;
  H264_StorePic_t *p_local;
  H264_DpbBuf_t *p_Dpb_local;
  
  phVar2 = p_Dpb->p_Vid;
  phVar2->last_has_mmco_5 = 0;
  if ((p->idr_flag != 0) || (p->adaptive_ref_pic_buffering_flag == 0)) {
    p_Vid._4_4_ = MPP_ERR_VALUE;
    if ((h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_dpb","value error(%d).\n",(char *)0x0,0x428);
    }
    goto LAB_001c646d;
  }
  while (p->dec_ref_pic_marking_buffer != (h264_drpm_t *)0x0) {
    phVar3 = p->dec_ref_pic_marking_buffer;
    switch(phVar3->memory_management_control_operation) {
    case 0:
      if (phVar3->Next != (h264_drpm_t *)0x0) {
        p_Vid._4_4_ = MPP_ERR_VALUE;
        if ((h264d_debug & 4) != 0) {
          _mpp_log_l(4,"h264d_dpb","value error(%d).\n",(char *)0x0,0x42d);
        }
        goto LAB_001c646d;
      }
      break;
    case 1:
      mm_unmark_short_term_for_reference(p_Dpb,p,phVar3->difference_of_pic_nums_minus1);
      update_ref_list(p_Dpb);
      break;
    case 2:
      mm_unmark_long_term_for_reference(p_Dpb,p,phVar3->long_term_pic_num);
      update_ltref_list(p_Dpb);
      break;
    case 3:
      mm_assign_long_term_frame_idx
                (p_Dpb,p,phVar3->difference_of_pic_nums_minus1,phVar3->long_term_frame_idx);
      update_ref_list(p_Dpb);
      update_ltref_list(p_Dpb);
      break;
    case 4:
      mm_update_max_long_term_frame_idx(p_Dpb,phVar3->max_long_term_frame_idx_plus1);
      update_ltref_list(p_Dpb);
      break;
    case 5:
      mm_unmark_all_short_term_for_reference(p_Dpb);
      mm_unmark_all_long_term_for_reference(p_Dpb);
      phVar2->last_has_mmco_5 = 1;
      break;
    case 6:
      if (phVar3->max_long_term_frame_idx_plus1 == 0) {
        phVar3->max_long_term_frame_idx_plus1 = p_Dpb->num_ref_frames;
      }
      mm_mark_current_picture_long_term(p_Dpb,p,phVar3->long_term_frame_idx);
      check_num_ref(p_Dpb);
      break;
    default:
      p_Vid._4_4_ = MPP_NOK;
      goto LAB_001c646d;
    }
    p->dec_ref_pic_marking_buffer = phVar3->Next;
  }
  if (phVar2->last_has_mmco_5 == 0) {
LAB_001c645d:
    p_Dpb_local._4_4_ = MPP_OK;
  }
  else {
    p->frame_num = 0;
    p->pic_num = 0;
    iVar1 = p->structure;
    if (iVar1 == 1) {
      p->is_mmco_5 = '\x01';
      p->top_poc_mmco5 = p->top_poc;
      p->top_poc = 0;
      p->poc = 0;
    }
    else if (iVar1 == 2) {
      p->is_mmco_5 = '\x01';
      p->bot_poc_mmco5 = p->bottom_poc;
      p->bottom_poc = 0;
      p->poc = 0;
    }
    else if (iVar1 == 3) {
      p->is_mmco_5 = '\x01';
      p->top_poc_mmco5 = p->top_poc;
      p->bot_poc_mmco5 = p->bottom_poc;
      if (p->bottom_poc < p->top_poc) {
        local_48 = p->bottom_poc;
      }
      else {
        local_48 = p->top_poc;
      }
      p->poc_mmco5 = local_48;
      p->top_poc = p->top_poc - p->poc;
      p->bottom_poc = p->bottom_poc - p->poc;
      if (p->bottom_poc < p->top_poc) {
        local_4c = p->bottom_poc;
      }
      else {
        local_4c = p->top_poc;
      }
      p->poc = local_4c;
      p->frame_poc = p->poc;
    }
    if (p->layer_id == 0) {
      p_Vid._4_4_ = flush_dpb(phVar2->p_Dpb_layer[0],1);
      if (MPP_NOK < p_Vid._4_4_) goto LAB_001c645d;
      if ((h264d_debug & 4) != 0) {
        _mpp_log_l(4,"h264d_dpb","Function error(%d).\n",(char *)0x0,0x470);
      }
    }
    else {
      p_Vid._4_4_ = flush_dpb(phVar2->p_Dpb_layer[1],2);
      if (MPP_NOK < p_Vid._4_4_) goto LAB_001c645d;
      if ((h264d_debug & 4) != 0) {
        _mpp_log_l(4,"h264d_dpb","Function error(%d).\n",(char *)0x0,0x472);
      }
    }
LAB_001c646d:
    p_Dpb_local._4_4_ = p_Vid._4_4_;
  }
  return p_Dpb_local._4_4_;
}

Assistant:

static MPP_RET adaptive_memory_management(H264_DpbBuf_t *p_Dpb, H264_StorePic_t *p)
{
    H264_DRPM_t *tmp_drpm = NULL;
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dVideoCtx_t *p_Vid = p_Dpb->p_Vid;

    p_Vid->last_has_mmco_5 = 0;
    VAL_CHECK(ret, !p->idr_flag && p->adaptive_ref_pic_buffering_flag);
    while (p->dec_ref_pic_marking_buffer) {
        tmp_drpm = p->dec_ref_pic_marking_buffer;
        switch (tmp_drpm->memory_management_control_operation) {
        case 0:
            VAL_CHECK(ret, tmp_drpm->Next == NULL);
            break;
        case 1:
            mm_unmark_short_term_for_reference(p_Dpb, p, tmp_drpm->difference_of_pic_nums_minus1);
            update_ref_list(p_Dpb);
            break;
        case 2:
            mm_unmark_long_term_for_reference(p_Dpb, p, tmp_drpm->long_term_pic_num);
            update_ltref_list(p_Dpb);
            break;
        case 3:
            mm_assign_long_term_frame_idx(p_Dpb, p, tmp_drpm->difference_of_pic_nums_minus1, tmp_drpm->long_term_frame_idx);
            update_ref_list(p_Dpb);
            update_ltref_list(p_Dpb);
            break;
        case 4:
            mm_update_max_long_term_frame_idx(p_Dpb, tmp_drpm->max_long_term_frame_idx_plus1);
            update_ltref_list(p_Dpb);
            break;
        case 5:
            mm_unmark_all_short_term_for_reference(p_Dpb);
            mm_unmark_all_long_term_for_reference(p_Dpb);
            p_Vid->last_has_mmco_5 = 1;
            break;
        case 6:
            //!< conceal max_long_term_frame_idx_plus1
            if (!tmp_drpm->max_long_term_frame_idx_plus1) {
                tmp_drpm->max_long_term_frame_idx_plus1 = p_Dpb->num_ref_frames;
            }
            mm_mark_current_picture_long_term(p_Dpb, p, tmp_drpm->long_term_frame_idx);
            check_num_ref(p_Dpb);
            break;
        default:
            ret = MPP_NOK;
            goto __FAILED;
        }
        p->dec_ref_pic_marking_buffer = tmp_drpm->Next;
    }
    if (p_Vid->last_has_mmco_5) { //!< similar IDR frame
        p->pic_num = p->frame_num = 0;
        switch (p->structure) {
        case TOP_FIELD:
            p->is_mmco_5 = 1;
            p->top_poc_mmco5 = p->top_poc;
            p->poc = p->top_poc = 0;
            break;

        case BOTTOM_FIELD:
            p->is_mmco_5 = 1;
            p->bot_poc_mmco5 = p->bottom_poc;
            p->poc = p->bottom_poc = 0;
            break;

        case FRAME:
            p->is_mmco_5 = 1;
            p->top_poc_mmco5 = p->top_poc;
            p->bot_poc_mmco5 = p->bottom_poc;
            p->poc_mmco5 = MPP_MIN(p->top_poc, p->bottom_poc);
            p->top_poc -= p->poc;
            p->bottom_poc -= p->poc;

            p->poc = MPP_MIN(p->top_poc, p->bottom_poc);
            p->frame_poc = p->poc;
            break;

        }
        if (p->layer_id == 0) {
            FUN_CHECK(ret = flush_dpb(p_Vid->p_Dpb_layer[0], 1));
        } else {
            FUN_CHECK(ret = flush_dpb(p_Vid->p_Dpb_layer[1], 2));
        }
    }
    return ret = MPP_OK;
__FAILED:
    return ret;
}